

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O1

void __thiscall
Diligent::
DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
                  TextureViewDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  RenderDeviceGLImpl *pRVar2;
  TEXTURE_VIEW_TYPE TVar3;
  RESOURCE_DIMENSION RVar4;
  TEXTURE_FORMAT TVar5;
  Uint32 UVar6;
  Uint32 UVar7;
  anon_union_4_2_fd7742d7_for_TextureViewDesc_6 aVar8;
  anon_union_4_2_468fdb0b_for_TextureViewDesc_8 aVar9;
  UAV_ACCESS_FLAG UVar10;
  TEXTURE_VIEW_FLAGS TVar11;
  TEXTURE_COMPONENT_SWIZZLE TVar12;
  TEXTURE_COMPONENT_SWIZZLE TVar13;
  int iVar14;
  size_t sVar15;
  IMemoryAllocator *pIVar16;
  char *pcVar17;
  undefined4 extraout_var_00;
  TextureViewDesc *Args_1;
  string msg;
  string local_48;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  RefCountedObject<Diligent::ITextureViewGL>::RefCountedObject<>
            ((RefCountedObject<Diligent::ITextureViewGL> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::ITextureViewGL>).
  super_RefCountedObject<Diligent::ITextureViewGL>.super_ITextureViewGL.super_ITextureView.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00423b28;
  this->m_pDevice = pDevice;
  TVar3 = ObjDesc->ViewType;
  RVar4 = ObjDesc->TextureDim;
  TVar5 = ObjDesc->Format;
  UVar6 = ObjDesc->MostDetailedMip;
  UVar7 = ObjDesc->NumMipLevels;
  aVar8 = ObjDesc->field_5;
  aVar9 = ObjDesc->field_6;
  UVar10 = ObjDesc->AccessFlags;
  TVar11 = ObjDesc->Flags;
  TVar12 = (ObjDesc->Swizzle).R;
  TVar13 = (ObjDesc->Swizzle).G;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).ViewType = TVar3;
  (this->m_Desc).TextureDim = RVar4;
  (this->m_Desc).Format = TVar5;
  (this->m_Desc).MostDetailedMip = UVar6;
  (this->m_Desc).NumMipLevels = UVar7;
  (this->m_Desc).field_5 = aVar8;
  (this->m_Desc).field_6 = aVar9;
  (this->m_Desc).AccessFlags = UVar10;
  (this->m_Desc).Flags = TVar11;
  (this->m_Desc).Swizzle.R = TVar12;
  (this->m_Desc).Swizzle.G = TVar13;
  *(undefined8 *)&(this->m_Desc).Swizzle.B = *(undefined8 *)&(ObjDesc->Swizzle).B;
  if (pDevice == (RenderDeviceGLImpl *)0x0) {
    iVar14 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_UniqueId;
    iVar14 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar14 = iVar14 + 1;
  }
  this->m_UniqueID = iVar14;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    if (this->m_pDevice == (RenderDeviceGLImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",(char (*) [21])Args_1);
      Args_1 = (TextureViewDesc *)0x47;
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    pRVar2 = this->m_pDevice;
    if ((pRVar2->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
        super_ObjectBase<Diligent::IRenderDeviceGL>.
        super_RefCountedObject<Diligent::IRenderDeviceGL>.m_pRefCounters == (RefCountersImpl *)0x0)
    {
      FormatString<char[26],char[26]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef
              ((pRVar2->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
               super_ObjectBase<Diligent::IRenderDeviceGL>.
               super_RefCountedObject<Diligent::IRenderDeviceGL>.m_pRefCounters);
  }
  pcVar17 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar17 == (char *)0x0) {
    pIVar16 = GetStringAllocator();
    iVar14 = (**pIVar16->_vptr_IMemoryAllocator)
                       (pIVar16,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar17 = (char *)CONCAT44(extraout_var_00,iVar14);
    snprintf(pcVar17,0x13,"0x%llX",this);
  }
  else {
    sVar15 = strlen(pcVar17);
    pIVar16 = GetStringAllocator();
    iVar14 = (**pIVar16->_vptr_IMemoryAllocator)
                       (pIVar16,sVar15 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar17 = (char *)CONCAT44(extraout_var,iVar14);
    memcpy(pcVar17,(ObjDesc->super_DeviceObjectAttribs).Name,sVar15 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar17;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }